

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_unique_ptr.hpp
# Opt level: O0

unique_ptr<Catch::Generators::Generators<std::tuple<float,_float,_float>_>_> __thiscall
Catch::Detail::
make_unique<Catch::Generators::Generators<std::tuple<float,float,float>>,Catch::Generators::Generators<std::tuple<float,float,float>>>
          (Detail *this,Generators<std::tuple<float,_float,_float>_> *args)

{
  Generators<std::tuple<float,_float,_float>_> *this_00;
  Generators<std::tuple<float,_float,_float>_> *args_local;
  
  this_00 = (Generators<std::tuple<float,_float,_float>_> *)operator_new(0x50);
  Catch::Generators::Generators<std::tuple<float,_float,_float>_>::Generators(this_00,args);
  unique_ptr<Catch::Generators::Generators<std::tuple<float,_float,_float>_>_>::unique_ptr
            ((unique_ptr<Catch::Generators::Generators<std::tuple<float,_float,_float>_>_> *)this,
             this_00);
  return (unique_ptr<Catch::Generators::Generators<std::tuple<float,_float,_float>_>_>)
         (Generators<std::tuple<float,_float,_float>_> *)this;
}

Assistant:

unique_ptr<T> make_unique(Args&&... args) {
        return unique_ptr<T>(new T(CATCH_FORWARD(args)...));
    }